

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsFreewheel::ArchiveIN(ChShaftsFreewheel *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsFreewheel>(marchive);
  ChArchiveIn::VersionRead<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveIN((ChPhysicsItem *)this,marchive);
  local_30 = &this->step;
  local_38 = "step";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = (double *)&this->jamming_mode;
  local_38 = "jamming_mode";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = &this->phase;
  local_38 = "phase";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->alpha_max;
  local_38 = "alpha_max";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = (double *)&this->free_forward;
  local_38 = "free_forward";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsFreewheel::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsFreewheel>();

    // deserialize parent class:
    ChShaftsCouple::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(step);
    marchive >> CHNVP(jamming_mode);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(alpha_max);
    marchive >> CHNVP(free_forward);
}